

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HonokaMiku.cc
# Opt level: O2

int32_t GetGameProp(char *str)

{
  char cVar1;
  int iVar2;
  size_t sVar3;
  uint uVar4;
  
  cVar1 = str[1];
  if ((cVar1 == '\0') || (str[2] == '\0')) {
    uVar4 = 0x30000;
    if (0xf6 < (byte)(cVar1 - 0x3aU)) {
      uVar4 = cVar1 * 0x10000 - 0x300000;
    }
    cVar1 = *str;
    if (cVar1 == 'c') goto LAB_001060c5;
    if (cVar1 == 'j') {
      return uVar4;
    }
    if (cVar1 == 't') goto LAB_001060cf;
    if (cVar1 == 'w') goto LAB_001060ca;
  }
  sVar3 = strlen(str);
  uVar4 = 0x30000;
  if (sVar3 == 9) {
    if ((int)str[8] - 0x3aU < 0xfffffff7) {
      return -1;
    }
    uVar4 = str[8] * 0x10000 - 0x300000;
  }
  iVar2 = msvcr110_strnicmp(str,"sif-jp",6);
  if (iVar2 == 0) {
    return uVar4;
  }
  iVar2 = msvcr110_strnicmp(str,"sif-ww",6);
  if ((iVar2 == 0) || (iVar2 = msvcr110_strnicmp(str,"sif-en",6), iVar2 == 0)) {
LAB_001060ca:
    return uVar4 | 1;
  }
  iVar2 = msvcr110_strnicmp(str,"sif-tw",6);
  if (iVar2 == 0) {
LAB_001060cf:
    return uVar4 | 2;
  }
  iVar2 = msvcr110_strnicmp(str,"sif-cn",6);
  uVar4 = uVar4 | -(uint)(iVar2 != 0);
LAB_001060c5:
  return uVar4 | 3;
}

Assistant:

int32_t GetGameProp(const char* str)
{
	uint32_t game_prop = (-1);

	// Single character check
	if(str[1] == 0 || str[2] == 0)
	{
		uint32_t defver = (str[1] == 0 || str[1] > 57 || str[1] < 49 ? HONOKAMIKU_DECRYPT_V3 : int32_t(str[1] - 48) << 16);

		if(str[0] == 'j')
			game_prop = HONOKAMIKU_GAMETYPE_JP | defver;
		else if(str[0] == 'w')
			game_prop = HONOKAMIKU_GAMETYPE_EN | defver;
		else if(str[0] == 't')
			game_prop = HONOKAMIKU_GAMETYPE_TW | defver;
		else if(str[0] == 'c')
			game_prop = HONOKAMIKU_GAMETYPE_CN | defver;
	}

	if(game_prop != 0xFFFFFFFF)
		return game_prop;

	// Multi-character-check
	uint32_t defver = (-1);

	if(strlen(str) == 9)
	{
		defver = int32_t(str[8] - 48);

		if(defver < 1 || defver > 9)
			return (-1);
		else
			defver <<= 16;
	}
	else
		defver = HONOKAMIKU_DECRYPT_V3;

	if(msvcr110_strnicmp(str, "sif-jp", 6) == 0)
		return HONOKAMIKU_GAMETYPE_JP | defver;
	else if(
		msvcr110_strnicmp(str, "sif-ww", 6) == 0 ||
		msvcr110_strnicmp(str, "sif-en", 6) == 0
	)
		return HONOKAMIKU_GAMETYPE_EN | defver;
	else if(msvcr110_strnicmp(str, "sif-tw", 6) == 0)
		return HONOKAMIKU_GAMETYPE_TW | defver;
	else if(msvcr110_strnicmp(str, "sif-cn", 6) == 0)
		return HONOKAMIKU_GAMETYPE_CN | defver;
	
	return (-1);
}